

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  bool bVar4;
  uint uVar5;
  ImU32 IVar6;
  ImPoolIdx index;
  int iVar7;
  ImGuiTableColumn *pIVar8;
  char *pcVar9;
  ImGuiTableColumn *pIVar10;
  uint in_ECX;
  int in_EDX;
  ImGuiID in_ESI;
  ImGuiWindowTempData *min;
  undefined8 *in_R8;
  float in_XMM0_Da;
  float fVar11;
  float fVar12;
  ImRect IVar13;
  int n_1;
  float scale_factor;
  float new_ref_scale_unit;
  int n;
  ImSpanAllocator<3> span_allocator;
  int stored_size;
  bool has_cell_padding_x;
  ImGuiWindow *inner_window;
  ImGuiWindowFlags child_flags;
  ImVec2 override_content_size;
  ImGuiID instance_id;
  int instance_no;
  ImGuiTableFlags table_last_flags;
  ImGuiTable *table;
  ImRect outer_rect;
  ImVec2 actual_outer_size;
  ImVec2 avail_size;
  bool use_child_window;
  ImGuiWindow *outer_window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffe18;
  float in_stack_fffffffffffffe1c;
  char cVar14;
  ImPool<ImGuiTable> *in_stack_fffffffffffffe20;
  ImPool<ImGuiTable> *in_stack_fffffffffffffe28;
  ImVector<ImGuiPtrOrIndex> *pIVar15;
  float in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  int idx;
  ImS8 IVar16;
  float in_stack_fffffffffffffe38;
  float in_stack_fffffffffffffe3c;
  ImSpanAllocator<3> *this;
  float local_1b4;
  float fVar17;
  float local_198;
  float local_190;
  int local_18c;
  int local_178;
  undefined1 local_16c [28];
  ImGuiTable *in_stack_fffffffffffffeb0;
  int local_104;
  undefined8 in_stack_ffffffffffffff48;
  ImVec2 *in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff64;
  ImVec2 local_94;
  int local_8c;
  int local_88;
  uint local_84;
  ImGuiTable *local_80;
  ImVec2 local_74;
  ImRect local_6c;
  undefined8 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  byte local_41;
  ImGuiWindow *local_40;
  ImGuiContext *local_38;
  float local_2c;
  undefined8 *local_28;
  uint local_1c;
  int local_18;
  ImGuiID local_14;
  bool local_1;
  
  local_38 = GImGui;
  local_2c = in_XMM0_Da;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_40 = GetCurrentWindow();
  if ((local_40->SkipItems & 1U) == 0) {
    if ((local_18 < 1) || (0x40 < local_18)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x1f3d,"BeginTableEx","ImGui ASSERT FAILED: %s",
                  "columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && \"Only 1..64 columns allowed!\""
                 );
    }
    if (((local_1c & 0x100000) != 0) && (local_2c < 0.0)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,7999,"BeginTableEx","ImGui ASSERT FAILED: %s","inner_width >= 0.0f");
    }
    local_41 = (local_1c & 0x300000) != 0;
    local_4c = GetContentRegionAvail();
    local_5c = *local_28;
    ImMax<float>(local_4c.x,1.0);
    if ((local_41 & 1) != 0) {
      ImMax<float>(local_4c.y,1.0);
    }
    IVar3.y = in_stack_fffffffffffffe3c;
    IVar3.x = in_stack_fffffffffffffe38;
    local_54 = CalcItemSize(IVar3,in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    min = &local_40->DC;
    local_74 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                           (ImVec2 *)0x2d097a);
    ImRect::ImRect(&local_6c,&min->CursorPos,&local_74);
    if (((local_41 & 1) == 0) ||
       (bVar4 = IsClippedEx((ImRect *)in_stack_fffffffffffffe28,
                            (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                            SUB81((ulong)in_stack_fffffffffffffe20 >> 0x18,0)), !bVar4)) {
      local_1c = TableFixFlags(local_1c);
      if ((local_40->Flags & 0x100U) != 0) {
        local_1c = local_1c | 0x20;
      }
      local_80 = ImPool<ImGuiTable>::GetOrAddByKey
                           (in_stack_fffffffffffffe28,
                            (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      local_84 = local_80->Flags;
      if (local_80->LastFrameActive == local_38->FrameCount) {
        local_18c = local_80->InstanceCurrent + 1;
      }
      else {
        local_18c = 0;
      }
      local_88 = local_18c;
      local_8c = local_14 + local_18c;
      if ((0 < local_18c) && (local_80->ColumnsCount != local_18)) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                    ,0x1f57,"BeginTableEx","ImGui ASSERT FAILED: %s",
                    "table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                   );
      }
      local_80->ID = local_14;
      local_80->Flags = local_1c;
      local_80->InstanceCurrent = (ImS16)local_88;
      local_80->LastFrameActive = local_38->FrameCount;
      local_80->InnerWindow = local_40;
      local_80->OuterWindow = local_40;
      local_80->ColumnsCount = local_18;
      ImVector<char>::resize
                ((ImVector<char> *)in_stack_fffffffffffffe20,(int)in_stack_fffffffffffffe1c);
      local_80->IsInitializing = false;
      local_80->IsLayoutLocked = false;
      local_80->InnerWidth = local_2c;
      (local_80->OuterRect).Min = local_6c.Min;
      (local_80->OuterRect).Max = local_6c.Max;
      (local_80->WorkRect).Min = local_6c.Min;
      (local_80->WorkRect).Max = local_6c.Max;
      if ((local_41 & 1) != 0) {
        ImVec2::ImVec2(&local_94,3.4028235e+38,3.4028235e+38);
        if (((local_1c & 0x100000) != 0) && ((local_1c & 0x200000) == 0)) {
          local_94.y = 1.1754944e-38;
        }
        if (((local_1c & 0x100000) != 0) && (0.0 < local_2c)) {
          local_94.x = local_2c;
        }
        if ((((local_94.x != 3.4028235e+38) || (NAN(local_94.x))) || (local_94.y != 3.4028235e+38))
           || (NAN(local_94.y))) {
          if ((local_94.x != 3.4028235e+38) || (NAN(local_94.x))) {
            local_190 = local_94.x;
          }
          else {
            local_190 = 0.0;
          }
          if ((local_94.y != 3.4028235e+38) || (NAN(local_94.y))) {
            local_198 = local_94.y;
          }
          else {
            local_198 = 0.0;
          }
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,local_190,local_198);
          SetNextWindowContentSize((ImVec2 *)&stack0xffffffffffffff64);
        }
        uVar5 = (local_1c & 0x100000) >> 9;
        IVar3 = ImRect::GetSize((ImRect *)
                                CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        BeginChildEx((char *)CONCAT44(in_stack_ffffffffffffff64,uVar5),(ImGuiID)IVar3.y,
                     in_stack_ffffffffffffff50,SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0),
                     (ImGuiWindowFlags)in_stack_ffffffffffffff48);
        local_80->InnerWindow = local_38->CurrentWindow;
        IVar3 = (local_80->InnerWindow->WorkRect).Max;
        (local_80->WorkRect).Min = (local_80->InnerWindow->WorkRect).Min;
        (local_80->WorkRect).Max = IVar3;
        IVar13 = ImGuiWindow::Rect((ImGuiWindow *)0x2d0e2d);
        (local_80->OuterRect).Min = IVar13.Min;
        (local_80->OuterRect).Max = IVar13.Max;
      }
      PushOverrideID((ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      pIVar2 = local_80->InnerWindow;
      local_80->HostIndentX = (pIVar2->DC).Indent.x;
      (local_80->HostClipRect).Min = (pIVar2->ClipRect).Min;
      (local_80->HostClipRect).Max = (pIVar2->ClipRect).Max;
      local_80->HostSkipItems = (bool)(pIVar2->SkipItems & 1);
      (local_80->HostWorkRect).Min = (pIVar2->WorkRect).Min;
      (local_80->HostWorkRect).Max = (pIVar2->WorkRect).Max;
      local_80->HostCursorMaxPos = (pIVar2->DC).CursorMaxPos;
      bVar4 = (local_1c & 0x400) == 0;
      if (bVar4) {
        fVar11 = 0.0;
      }
      else {
        fVar11 = (local_38->Style).CellPadding.x + 1.0;
      }
      local_80->CellPaddingX1 = fVar11;
      if (bVar4) {
        fVar17 = 0.0;
      }
      else {
        fVar17 = (local_38->Style).CellPadding.x;
      }
      local_80->CellPaddingX2 = fVar17;
      local_80->CellPaddingY = (local_38->Style).CellPadding.y;
      if (bVar4) {
        local_1b4 = (local_38->Style).CellPadding.x;
      }
      else {
        local_1b4 = 0.0;
      }
      local_80->CellSpacingX = local_1b4;
      local_80->CurrentColumn = -1;
      local_80->CurrentRow = -1;
      local_80->RowBgColorCounter = 0;
      *(uint *)&local_80->field_0x94 = *(uint *)&local_80->field_0x94 & 0xffff;
      if (pIVar2 == local_40) {
        this = (ImSpanAllocator<3> *)&local_80->WorkRect;
      }
      else {
        this = (ImSpanAllocator<3> *)&pIVar2->ClipRect;
      }
      (local_80->InnerClipRect).Min = *(ImVec2 *)&this->BasePtr;
      (local_80->InnerClipRect).Max = *(ImVec2 *)&this->TotalSize;
      ImRect::ClipWith((ImRect *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (ImRect *)in_stack_fffffffffffffe28);
      ImRect::ClipWith((ImRect *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (ImRect *)in_stack_fffffffffffffe28);
      if ((local_1c & 0x40000) == 0) {
        fVar12 = (pIVar2->ClipRect).Max.y;
      }
      else {
        fVar12 = (local_80->WorkRect).Max.y;
      }
      (local_80->InnerClipRect).Max.y = fVar12;
      (local_80->BackgroundClipRect).Min = (local_80->InnerClipRect).Min;
      (local_80->BackgroundClipRect).Max = (local_80->InnerClipRect).Max;
      fVar1 = (local_80->WorkRect).Min.y;
      local_80->RowPosY2 = fVar1;
      local_80->RowPosY1 = fVar1;
      local_80->RowTextBaseline = 0.0;
      local_80->FreezeRowsRequest = (ImS8)((int)(local_1c & 0xc00000) >> 0x16);
      fVar1 = (pIVar2->Scroll).y;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        IVar16 = local_80->FreezeRowsRequest;
      }
      else {
        IVar16 = '\0';
      }
      local_80->FreezeRowsCount = IVar16;
      local_80->FreezeColumnsRequest = (byte)(local_1c >> 0x18) & 3;
      fVar1 = (pIVar2->Scroll).x;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        idx = (int)local_80->FreezeColumnsRequest;
      }
      else {
        idx = 0;
      }
      local_80->FreezeColumnsCount = (ImS8)idx;
      local_80->IsFreezeRowsPassed = local_80->FreezeRowsCount == '\0';
      local_80->DeclColumnsCount = '\0';
      local_80->RightMostVisibleColumn = -1;
      IVar6 = GetColorU32(idx,in_stack_fffffffffffffe30);
      local_80->BorderColorStrong = IVar6;
      IVar6 = GetColorU32(idx,in_stack_fffffffffffffe30);
      local_80->BorderColorLight = IVar6;
      local_80->BorderX1 = (local_80->InnerClipRect).Min.x;
      local_80->BorderX2 = (local_80->InnerClipRect).Max.x;
      pIVar15 = &local_38->CurrentTableStack;
      index = ImPool<ImGuiTable>::GetIndex
                        (in_stack_fffffffffffffe20,
                         (ImGuiTable *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)
                        );
      ImGuiPtrOrIndex::ImGuiPtrOrIndex((ImGuiPtrOrIndex *)&stack0xffffffffffffff28,index);
      ImVector<ImGuiPtrOrIndex>::push_back
                ((ImVector<ImGuiPtrOrIndex> *)in_stack_fffffffffffffe20,
                 (ImGuiPtrOrIndex *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_38->CurrentTable = local_80;
      (local_40->DC).CurrentTable = local_80;
      if (((local_84 & 2) != 0) && ((local_1c & 2) == 0)) {
        local_80->IsResetDisplayOrderRequest = true;
      }
      iVar7 = ImSpan<ImGuiTableColumn>::size(&local_80->Columns);
      if ((iVar7 != 0) && (iVar7 != local_18)) {
        ImVector<char>::resize
                  ((ImVector<char> *)in_stack_fffffffffffffe20,(int)in_stack_fffffffffffffe1c);
      }
      if ((local_80->RawData).Size == 0) {
        ImSpanAllocator<3>::ImSpanAllocator((ImSpanAllocator<3> *)0x2d14a3);
        ImSpanAllocator<3>::ReserveBytes
                  ((ImSpanAllocator<3> *)CONCAT44(idx,in_stack_fffffffffffffe30),
                   (int)((ulong)pIVar15 >> 0x20),(size_t)in_stack_fffffffffffffe20);
        ImSpanAllocator<3>::ReserveBytes
                  ((ImSpanAllocator<3> *)CONCAT44(idx,in_stack_fffffffffffffe30),
                   (int)((ulong)pIVar15 >> 0x20),(size_t)in_stack_fffffffffffffe20);
        ImSpanAllocator<3>::ReserveBytes
                  ((ImSpanAllocator<3> *)CONCAT44(idx,in_stack_fffffffffffffe30),
                   (int)((ulong)pIVar15 >> 0x20),(size_t)in_stack_fffffffffffffe20);
        pIVar10 = (ImGuiTableColumn *)&local_80->RawData;
        ImSpanAllocator<3>::GetArenaSizeInBytes((ImSpanAllocator<3> *)&stack0xffffffffffffff00);
        ImVector<char>::resize((ImVector<char> *)pIVar10,(int)in_stack_fffffffffffffe1c);
        ImSpanAllocator<3>::SetArenaBasePtr
                  ((ImSpanAllocator<3> *)&stack0xffffffffffffff00,(local_80->RawData).Data);
        ImSpanAllocator<3>::GetSpan<ImGuiTableColumn>
                  (this,(int)fVar12,
                   (ImSpan<ImGuiTableColumn> *)CONCAT44(idx,in_stack_fffffffffffffe30));
        ImSpanAllocator<3>::GetSpan<signed_char>
                  (this,(int)fVar12,(ImSpan<signed_char> *)CONCAT44(idx,in_stack_fffffffffffffe30));
        ImSpanAllocator<3>::GetSpan<ImGuiTableCellData>
                  (this,(int)fVar12,
                   (ImSpan<ImGuiTableCellData> *)CONCAT44(idx,in_stack_fffffffffffffe30));
        for (local_104 = 0; local_104 < local_18; local_104 = local_104 + 1) {
          ImGuiTableColumn::ImGuiTableColumn(pIVar10);
          pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                             ((ImSpan<ImGuiTableColumn> *)CONCAT44(idx,in_stack_fffffffffffffe30),
                              (int)((ulong)pIVar15 >> 0x20));
          memcpy(pIVar8,local_16c,0x65);
          cVar14 = (char)local_104;
          pcVar9 = ImSpan<signed_char>::operator[]
                             ((ImSpan<signed_char> *)CONCAT44(idx,in_stack_fffffffffffffe30),
                              (int)((ulong)pIVar15 >> 0x20));
          *pcVar9 = cVar14;
          pIVar8 = ImSpan<ImGuiTableColumn>::operator[]
                             ((ImSpan<ImGuiTableColumn> *)CONCAT44(idx,in_stack_fffffffffffffe30),
                              (int)((ulong)pIVar15 >> 0x20));
          pIVar8->DisplayOrder = cVar14;
        }
        local_80->IsSortSpecsDirty = true;
        local_80->IsSettingsRequestLoad = true;
        local_80->IsInitializing = true;
      }
      if ((local_80->IsSettingsRequestLoad & 1U) != 0) {
        TableLoadSettings((ImGuiTable *)CONCAT44(fVar11,fVar17));
      }
      fVar11 = local_38->FontSize;
      if (((local_80->RefScale != 0.0) || (NAN(local_80->RefScale))) &&
         ((local_80->RefScale != fVar11 || (NAN(local_80->RefScale) || NAN(fVar11))))) {
        fVar17 = local_80->RefScale;
        for (local_178 = 0; local_178 < local_18; local_178 = local_178 + 1) {
          pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                              ((ImSpan<ImGuiTableColumn> *)CONCAT44(idx,in_stack_fffffffffffffe30),
                               (int)((ulong)pIVar15 >> 0x20));
          fVar12 = pIVar10->WidthRequest * (fVar11 / fVar17);
          pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                              ((ImSpan<ImGuiTableColumn> *)CONCAT44(idx,in_stack_fffffffffffffe30),
                               (int)((ulong)pIVar15 >> 0x20));
          pIVar10->WidthRequest = fVar12;
        }
      }
      local_80->RefScale = fVar11;
      pIVar2->SkipItems = true;
      TableBeginUpdateColumns(in_stack_fffffffffffffeb0);
      local_1 = true;
    }
    else {
      ItemSize((ImRect *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    if (use_child_window && IsClippedEx(outer_rect, 0, false))
    {
        ItemSize(outer_rect);
        return false;
    }

    flags = TableFixFlags(flags);
    if (outer_window->Flags & ImGuiWindowFlags_NoSavedSettings)
        flags |= ImGuiTableFlags_NoSavedSettings;

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const ImGuiTableFlags table_last_flags = table->Flags;
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->ColumnsNames.Buf.resize(0);
    table->IsInitializing = false;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    table->OuterRect = outer_rect;
    table->WorkRect = outer_rect;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Create scrolling region (without border = zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, table->OuterRect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
    }

    // Push a standardized ID for both child and not-child using tables, equivalent to BeginTable() doing PushID(label) matching
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    table->HostWorkRect = inner_window->WorkRect;
    table->HostCursorMaxPos = inner_window->DC.CursorMaxPos;

    // Borders
    // - None               ........Content..... Pad .....Content........
    // - OuterV             | Pad ..Content..... Pad .....Content.. Pad |       // FIXME-TABLE: Not handled properly
    // - InnerV             ........Content.. Pad | Pad ..Content........       // FIXME-TABLE: Not handled properly
    // - OuterV+InnerV      | Pad ..Content.. Pad | Pad ..Content.. Pad |

    const bool has_cell_padding_x = (flags & ImGuiTableFlags_BordersOuterV) != 0;
    table->CellPaddingX1 = has_cell_padding_x ? g.Style.CellPadding.x + 1.0f : 0.0f;
    table->CellPaddingX2 = has_cell_padding_x ? g.Style.CellPadding.x : 0.0f;
    table->CellPaddingY = g.Style.CellPadding.y;
    table->CellSpacingX = has_cell_padding_x ? 0.0f : g.Style.CellPadding.x;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWith(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? table->WorkRect.Max.y : inner_window->ClipRect.Max.y;
    table->BackgroundClipRect = table->InnerClipRect;
    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = (ImS8)((flags & ImGuiTableFlags_ScrollFreezeRowsMask_) >> ImGuiTableFlags_ScrollFreezeRowsShift_);
    table->FreezeRowsCount = (inner_window->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->FreezeColumnsRequest = (ImS8)((flags & ImGuiTableFlags_ScrollFreezeColumnsMask_) >> ImGuiTableFlags_ScrollFreezeColumnsShift_);
    table->FreezeColumnsCount = (inner_window->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->IsFreezeRowsPassed = (table->FreezeRowsCount == 0);
    table->DeclColumnsCount = 0;
    table->RightMostVisibleColumn = -1;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);
    table->BorderX1 = table->InnerClipRect.Min.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : -1.0f);
    table->BorderX2 = table->InnerClipRect.Max.x;// +((table->Flags & ImGuiTableFlags_BordersOuter) ? 0.0f : +1.0f);

    // Make table current
    g.CurrentTableStack.push_back(ImGuiPtrOrIndex(g.Tables.GetIndex(table)));
    g.CurrentTable = table;
    outer_window->DC.CurrentTable = table;
    if ((table_last_flags & ImGuiTableFlags_Reorderable) && !(flags & ImGuiTableFlags_Reorderable))
        table->IsResetDisplayOrderRequest = true;

    // Setup default columns state. Clear data if columns count changed
    const int stored_size = table->Columns.size();
    if (stored_size != 0 && stored_size != columns_count)
        table->RawData.resize(0);
    if (table->RawData.Size == 0)
    {
        // Allocate single buffer for our arrays
        ImSpanAllocator<3> span_allocator;
        span_allocator.ReserveBytes(0, columns_count * sizeof(ImGuiTableColumn));
        span_allocator.ReserveBytes(1, columns_count * sizeof(ImS8));
        span_allocator.ReserveBytes(2, columns_count * sizeof(ImGuiTableCellData));
        table->RawData.resize(span_allocator.GetArenaSizeInBytes());
        span_allocator.SetArenaBasePtr(table->RawData.Data);
        span_allocator.GetSpan(0, &table->Columns);
        span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
        span_allocator.GetSpan(2, &table->RowCellData);

        for (int n = 0; n < columns_count; n++)
        {
            table->Columns[n] = ImGuiTableColumn();
            table->Columns[n].DisplayOrder = table->DisplayOrderToIndex[n] = (ImS8)n;
        }
        table->IsInitializing = table->IsSettingsRequestLoad = table->IsSortSpecsDirty = true;
    }

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextCell() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Update/lock which columns will be Visible for the frame
    TableBeginUpdateColumns(table);

    return true;
}